

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O2

int tnt_reply_hdr0(tnt_reply *r,char *buf,size_t size,size_t *off)

{
  int iVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  char *local_68;
  char *test;
  tnt_reply *local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  byte *local_38;
  char *p;
  
  local_68 = buf;
  local_38 = (byte *)buf;
  iVar1 = mp_check(&local_68,buf + size);
  iVar4 = -1;
  if ((iVar1 == 0) && (mp_type_hint[(byte)*buf] == MP_MAP)) {
    test = (char *)off;
    local_58 = r;
    uVar2 = mp_decode_map((char **)&local_38);
    local_40 = 0;
    local_48 = 0;
    local_50 = 0;
    uVar5 = 0;
    while (bVar6 = uVar2 != 0, uVar2 = uVar2 - 1, bVar6) {
      if ((mp_type_hint[*local_38] != MP_UINT) ||
         (uVar3 = mp_decode_uint((char **)&local_38), mp_type_hint[*local_38] != MP_UINT)) {
        return -1;
      }
      iVar4 = (int)uVar3;
      if (iVar4 == 0) {
        local_48 = mp_decode_uint((char **)&local_38);
      }
      else if (iVar4 == 5) {
        local_50 = mp_decode_uint((char **)&local_38);
      }
      else {
        if (iVar4 != 1) {
          return -1;
        }
        local_40 = mp_decode_uint((char **)&local_38);
      }
      uVar5 = uVar5 | 1L << (uVar3 & 0x3f);
    }
    if (local_58 != (tnt_reply *)0x0) {
      local_58->sync = local_40;
      local_58->code = (ulong)((uint)local_48 & 0x7fff);
      local_58->schema_id = local_50;
      local_58->bitmap = uVar5;
    }
    iVar4 = 0;
    if (test != (char *)0x0) {
      *(long *)test = (long)local_38 - (long)buf;
    }
  }
  return iVar4;
}

Assistant:

int
tnt_reply_hdr0(struct tnt_reply *r, const char *buf, size_t size, size_t *off) {
	const char *test = buf;
	const char *p = buf;
	if (mp_check(&test, p + size))
		return -1;
	if (mp_typeof(*p) != MP_MAP)
		return -1;

	uint32_t n = mp_decode_map(&p);
	uint64_t sync = 0, code = 0, schema_id = 0, bitmap = 0;
	while (n-- > 0) {
		if (mp_typeof(*p) != MP_UINT)
			return -1;
		uint32_t key = mp_decode_uint(&p);
		if (mp_typeof(*p) != MP_UINT)
			return -1;
		switch (key) {
		case TNT_SYNC:
			sync = mp_decode_uint(&p);
			break;
		case TNT_CODE:
			code = mp_decode_uint(&p);
			break;
		case TNT_SCHEMA_ID:
			schema_id = mp_decode_uint(&p);
			break;
		default:
			return -1;
		}
		bitmap |= (1ULL << key);
	}
	if (r) {
		r->sync = sync;
		r->code = code & ((1 << 15) - 1);
		r->schema_id = schema_id;
		r->bitmap = bitmap;
	}
	if (off)
		*off = p - buf;
	return 0;
}